

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::advance_past_deleted
          (sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  bool bVar1;
  destructive_iterator *in_RDI;
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  destructive_iterator *it;
  
  it = in_RDI;
  while( true ) {
    bVar1 = destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::operator!=((destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                          *)in_RDI,
                         (iterator *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    in_stack_ffffffffffffffef = false;
    if (bVar1) {
      in_stack_ffffffffffffffef =
           sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::test_deleted(unaff_retaddr,it);
    }
    if ((bool)in_stack_ffffffffffffffef == false) break;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::operator++((destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
                  *)in_RDI);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }